

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void __thiscall
basist::pvrtc4_block::set_endpoint_floor(pvrtc4_block *this,uint32_t endpoint_index,color32 *c)

{
  undefined8 in_RAX;
  ulong uVar1;
  bool opaque_endpoint;
  color32 *c_00;
  undefined1 *puVar2;
  color32 local_8;
  color32 local_4;
  
  c_00 = &local_8;
  if (endpoint_index < 2) {
    uVar1 = (ulong)(c->field_0).field_0.a;
    if (uVar1 == 0xff) {
      puVar2 = g_pvrtc_4_floor;
      if (endpoint_index != 0) {
        puVar2 = g_pvrtc_5_floor;
      }
      c_00 = &local_4;
      local_8.field_0 = SUB84(in_RAX,0);
      _local_8 = CONCAT17(8,CONCAT16(puVar2[(c->field_0).field_0.b],
                                     CONCAT15(g_pvrtc_5_floor[(c->field_0).field_0.g],
                                              CONCAT14(g_pvrtc_5_floor[(c->field_0).field_0.r],
                                                       local_8.field_0))));
      opaque_endpoint = true;
    }
    else {
      puVar2 = g_pvrtc_3_floor;
      if (endpoint_index != 0) {
        puVar2 = g_pvrtc_4_floor;
      }
      local_4.field_0 = SUB84((ulong)in_RAX >> 0x20,0);
      local_8.field_0 =
           (anon_union_4_3_898e29d3_for_color32_0)
           CONCAT13(g_pvrtc_alpha_floor[uVar1],
                    CONCAT12(puVar2[(c->field_0).field_0.b],
                             CONCAT11(g_pvrtc_4_floor[(c->field_0).field_0.g],
                                      g_pvrtc_4_floor[(c->field_0).field_0.r])));
      opaque_endpoint = false;
    }
    set_endpoint_raw(this,endpoint_index,c_00,opaque_endpoint);
    return;
  }
  __assert_fail("endpoint_index < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0xc75,"void basist::pvrtc4_block::set_endpoint_floor(uint32_t, const color32 &)");
}

Assistant:

inline void set_endpoint_floor(uint32_t endpoint_index, const color32& c)
		{
			assert(endpoint_index < 2);

			int a = g_pvrtc_alpha_floor[c.a];
			if (a == 8)
			{
				// 554 or 555
				uint32_t r = g_pvrtc_5_floor[c[0]], g = g_pvrtc_5_floor[c[1]], b = c[2];

				if (!endpoint_index)
					b = g_pvrtc_4_floor[b];
				else
					b = g_pvrtc_5_floor[b];

				set_endpoint_raw(endpoint_index, color32(r, g, b, a), true);
			}
			else
			{
				// 4433 or 4443
				uint32_t r = g_pvrtc_4_floor[c[0]], g = g_pvrtc_4_floor[c[1]], b = c[2];

				if (!endpoint_index)
					b = g_pvrtc_3_floor[b];
				else
					b = g_pvrtc_4_floor[b];

				set_endpoint_raw(endpoint_index, color32(r, g, b, a), false);
			}
		}